

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_input.cpp
# Opt level: O0

void UseX_Flush_Extra_Move_Events(XEvent *event_return)

{
  int iVar1;
  ostream *poVar2;
  int local_d8 [2];
  XEvent next_event_return;
  XEvent *pXStack_10;
  int cnt;
  XEvent *event_return_local;
  
  next_event_return.pad[0x17]._4_4_ = 0;
  pXStack_10 = event_return;
  if (event_return->type == 6) {
    while (iVar1 = XPending(Main_Display), iVar1 != 0) {
      XNextEvent(Main_Display,local_d8);
      if (local_d8[0] != 6) {
        XPutBackEvent(Main_Display,local_d8);
        break;
      }
      memcpy(pXStack_10,local_d8,0xc0);
      next_event_return.pad[0x17]._4_4_ = next_event_return.pad[0x17]._4_4_ + 1;
    }
  }
  if ((Am_Debug_Print_Input_Events != 0) && (0 < (int)next_event_return.pad[0x17]._4_4_)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"<> Ignoring ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,next_event_return.pad[0x17]._4_4_);
    poVar2 = std::operator<<(poVar2," move events\n");
    std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void
UseX_Flush_Extra_Move_Events(XEvent &event_return)
{
  int cnt = 0;
  if (event_return.xany.type == MotionNotify) {
    XEvent next_event_return;
    while (XPending(Main_Display)) {
      XNextEvent(Main_Display, &next_event_return);
      if (next_event_return.xany.type == MotionNotify) {
        event_return = next_event_return;
        cnt++;
      } else {
        XPutBackEvent(Main_Display, &next_event_return);
        break;
      }
    }
  }
  if (Am_Debug_Print_Input_Events && cnt > 0)
    std::cout << "<> Ignoring " << cnt << " move events\n" << std::flush;
}